

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

bool __thiscall
Shell::Options::NonGoalWeightOptionValue::setValue(NonGoalWeightOptionValue *this,string *value)

{
  bool bVar1;
  char *str;
  long in_RDI;
  float newValue;
  bool local_21;
  float local_20 [6];
  
  str = (char *)std::__cxx11::string::c_str();
  bVar1 = ::Lib::Int::stringToFloat(str,local_20);
  if (bVar1) {
    if (0.0 < local_20[0]) {
      *(float *)(in_RDI + 0x98) = local_20[0];
      *(int *)(in_RDI + 0xe0) = (int)(local_20[0] * 100.0);
      *(undefined4 *)(in_RDI + 0xe4) = 100;
      local_21 = true;
    }
    else {
      local_21 = false;
    }
  }
  else {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool Options::NonGoalWeightOptionValue::setValue(const std::string& value)
{
 float newValue;
 if(!Int::stringToFloat(value.c_str(),newValue)) return false;

 if(newValue <= 0.0) return false;

 actualValue=newValue;

  // actualValue contains numerator
  numerator=static_cast<int>(newValue*100);
  // otherValue contains denominator
  denominator=100;

  return true;
}